

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256_x86_shani.cpp
# Opt level: O0

void sha256_x86_shani::Transform(uint32_t *s,uchar *chunk,size_t blocks)

{
  long lVar1;
  longlong lVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  long in_FS_OFFSET;
  int iVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  __m128i so1;
  __m128i so0;
  size_t blocks_local;
  uchar *chunk_local;
  uint32_t *s_local;
  __m128i t2;
  __m128i t1;
  __m128i msg_15;
  __m128i msg_14;
  __m128i msg_13;
  __m128i msg_12;
  __m128i msg_11;
  __m128i msg_10;
  __m128i msg_9;
  __m128i msg_8;
  __m128i msg_7;
  __m128i msg_6;
  __m128i msg_5;
  __m128i msg_4;
  __m128i msg_3;
  __m128i msg_2;
  __m128i msg_1;
  __m128i msg;
  int local_1028;
  int iStack_1024;
  int iStack_1020;
  int iStack_101c;
  int local_1008;
  int iStack_1004;
  int iStack_1000;
  int iStack_ffc;
  int local_fe8;
  int iStack_fe4;
  int iStack_fe0;
  int iStack_fdc;
  int local_fc8;
  int iStack_fc4;
  int iStack_fc0;
  int iStack_fbc;
  int local_fa8;
  int iStack_fa4;
  int iStack_fa0;
  int iStack_f9c;
  int local_f88;
  int iStack_f84;
  int iStack_f80;
  int iStack_f7c;
  int local_f68;
  int iStack_f64;
  int iStack_f60;
  int iStack_f5c;
  int local_f48;
  int iStack_f44;
  int iStack_f40;
  int iStack_f3c;
  int local_f28;
  int iStack_f24;
  int iStack_f20;
  int iStack_f1c;
  int local_f08;
  int iStack_f04;
  int iStack_f00;
  int iStack_efc;
  int local_ee8;
  int iStack_ee4;
  int iStack_ee0;
  int iStack_edc;
  int local_ec8;
  int iStack_ec4;
  int iStack_ec0;
  int iStack_ebc;
  int local_ea8;
  int iStack_ea4;
  int iStack_ea0;
  int iStack_e9c;
  int local_e88;
  int iStack_e84;
  int iStack_e80;
  int iStack_e7c;
  int local_e68;
  int iStack_e64;
  int iStack_e60;
  int iStack_e5c;
  int local_e48;
  int iStack_e44;
  int iStack_e40;
  int iStack_e3c;
  int local_e28;
  int iStack_e24;
  int iStack_e20;
  int iStack_e1c;
  int local_e08;
  int iStack_e04;
  int iStack_e00;
  int iStack_dfc;
  int local_de8;
  int iStack_de4;
  int iStack_de0;
  int iStack_ddc;
  int local_dc8;
  int iStack_dc4;
  int iStack_dc0;
  int iStack_dbc;
  int local_da8;
  int iStack_da4;
  int iStack_da0;
  int iStack_d9c;
  int local_d88;
  int iStack_d84;
  int iStack_d80;
  int iStack_d7c;
  int local_d68;
  int iStack_d64;
  int iStack_d60;
  int iStack_d5c;
  int local_d48;
  int iStack_d44;
  int iStack_d40;
  int iStack_d3c;
  int local_d28;
  int iStack_d24;
  int iStack_d20;
  int iStack_d1c;
  int local_d08;
  int iStack_d04;
  int iStack_d00;
  int iStack_cfc;
  int local_ce8;
  int iStack_ce4;
  int iStack_ce0;
  int iStack_cdc;
  int local_cc8;
  int iStack_cc4;
  int iStack_cc0;
  int iStack_cbc;
  int local_ca8;
  int iStack_ca4;
  int iStack_ca0;
  int iStack_c9c;
  int local_c88;
  int iStack_c84;
  int iStack_c80;
  int iStack_c7c;
  __m128i t2_1;
  __m128i t1_1;
  __m128i s1;
  __m128i s0;
  __m128i m3;
  __m128i m2;
  __m128i m1;
  __m128i m0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(longlong *)s;
  s0[0]._0_4_ = (int)lVar2;
  uVar50 = (int)s0[0];
  s0[0]._4_4_ = (int)((ulong)lVar2 >> 0x20);
  uVar51 = s0[0]._4_4_;
  s0[1]._0_4_ = (int)*(undefined8 *)(s + 2);
  uVar52 = (int)s0[1];
  s0[1]._4_4_ = (int)((ulong)*(undefined8 *)(s + 2) >> 0x20);
  uVar53 = s0[1]._4_4_;
  s1[0]._0_4_ = (int)*(undefined8 *)(s + 4);
  s1[0]._4_4_ = (int)((ulong)*(undefined8 *)(s + 4) >> 0x20);
  s1[1]._0_4_ = (int)*(undefined8 *)(s + 6);
  s1[1]._4_4_ = (int)((ulong)*(undefined8 *)(s + 6) >> 0x20);
  s0[1]._4_4_ = (int)s1[0];
  s0[1]._0_4_ = s1[0]._4_4_;
  s0[0] = lVar2;
  auVar55._4_4_ = (int)s1[1];
  auVar55._0_4_ = s1[1]._4_4_;
  auVar55._8_4_ = s1[0]._4_4_;
  auVar55._12_4_ = (int)s1[0];
  auVar56._4_4_ = uVar50;
  auVar56._0_4_ = uVar51;
  auVar56._8_4_ = uVar53;
  auVar56._12_4_ = uVar52;
  s1 = (__m128i)pblendw(auVar55,auVar56,0xf0);
  blocks_local = blocks;
  chunk_local = chunk;
  while (lVar2 = s1[0], blocks_local != 0) {
    auVar59._8_8_ = 0xc0d0e0f08090a0b;
    auVar59._0_8_ = 0x405060700010203;
    auVar55 = pshufb(*(undefined1 (*) [16])chunk_local,auVar59);
    local_ea8 = auVar55._0_4_;
    iStack_ea4 = auVar55._4_4_;
    iStack_ea0 = auVar55._8_4_;
    iStack_e9c = auVar55._12_4_;
    local_ea8 = local_ea8 + 0x428a2f98;
    auVar7._4_4_ = iStack_ea4 + 0x71374491;
    auVar7._0_4_ = local_ea8;
    auVar7._12_4_ = iStack_e9c + -0x164a245b;
    auVar7._8_4_ = iStack_ea0 + -0x4a3f0431;
    auVar57 = sha256rnds2_sha((undefined1  [16])s1,(undefined1  [16])s0,auVar7);
    auVar6._4_4_ = iStack_e9c + -0x164a245b;
    auVar6._0_4_ = iStack_ea0 + -0x4a3f0431;
    auVar6._8_4_ = local_ea8;
    auVar6._12_4_ = local_ea8;
    auVar58 = sha256rnds2_sha((undefined1  [16])s0,auVar57,auVar6);
    auVar60._8_8_ = 0xc0d0e0f08090a0b;
    auVar60._0_8_ = 0x405060700010203;
    auVar56 = pshufb(*(undefined1 (*) [16])(chunk_local + 0x10),auVar60);
    local_e88 = auVar56._0_4_;
    iStack_e84 = auVar56._4_4_;
    iStack_e80 = auVar56._8_4_;
    iStack_e7c = auVar56._12_4_;
    local_e88 = local_e88 + 0x3956c25b;
    auVar9._4_4_ = iStack_e84 + 0x59f111f1;
    auVar9._0_4_ = local_e88;
    auVar9._12_4_ = iStack_e7c + -0x54e3a12b;
    auVar9._8_4_ = iStack_e80 + -0x6dc07d5c;
    auVar59 = sha256rnds2_sha(auVar57,auVar58,auVar9);
    auVar8._4_4_ = iStack_e7c + -0x54e3a12b;
    auVar8._0_4_ = iStack_e80 + -0x6dc07d5c;
    auVar8._8_4_ = local_e88;
    auVar8._12_4_ = local_e88;
    auVar58 = sha256rnds2_sha(auVar58,auVar59,auVar8);
    auVar55 = sha256msg1_sha(auVar55,auVar56);
    auVar4._8_8_ = 0xc0d0e0f08090a0b;
    auVar4._0_8_ = 0x405060700010203;
    auVar57 = pshufb(*(undefined1 (*) [16])(chunk_local + 0x20),auVar4);
    local_e68 = auVar57._0_4_;
    iStack_e64 = auVar57._4_4_;
    iStack_e60 = auVar57._8_4_;
    iStack_e5c = auVar57._12_4_;
    local_e68 = local_e68 + -0x27f85568;
    auVar11._4_4_ = iStack_e64 + 0x12835b01;
    auVar11._0_4_ = local_e68;
    auVar11._12_4_ = iStack_e5c + 0x550c7dc3;
    auVar11._8_4_ = iStack_e60 + 0x243185be;
    auVar59 = sha256rnds2_sha(auVar59,auVar58,auVar11);
    auVar10._4_4_ = iStack_e5c + 0x550c7dc3;
    auVar10._0_4_ = iStack_e60 + 0x243185be;
    auVar10._8_4_ = local_e68;
    auVar10._12_4_ = local_e68;
    auVar60 = sha256rnds2_sha(auVar58,auVar59,auVar10);
    auVar56 = sha256msg1_sha(auVar56,auVar57);
    auVar5._8_8_ = 0xc0d0e0f08090a0b;
    auVar5._0_8_ = 0x405060700010203;
    auVar58 = pshufb(*(undefined1 (*) [16])(chunk_local + 0x30),auVar5);
    local_e48 = auVar58._0_4_;
    iStack_e44 = auVar58._4_4_;
    iStack_e40 = auVar58._8_4_;
    iStack_e3c = auVar58._12_4_;
    iVar54 = local_e48 + 0x72be5d74;
    auVar13._4_4_ = iStack_e44 + -0x7f214e02;
    auVar13._0_4_ = iVar54;
    auVar13._12_4_ = iStack_e3c + -0x3e640e8c;
    auVar13._8_4_ = iStack_e40 + -0x6423f959;
    auVar59 = sha256rnds2_sha(auVar59,auVar60,auVar13);
    auVar12._4_4_ = iStack_e3c + -0x3e640e8c;
    auVar12._0_4_ = iStack_e40 + -0x6423f959;
    auVar12._8_4_ = iVar54;
    auVar12._12_4_ = iVar54;
    auVar60 = sha256rnds2_sha(auVar60,auVar59,auVar12);
    local_ec8 = auVar55._0_4_;
    iStack_ec4 = auVar55._4_4_;
    iStack_ec0 = auVar55._8_4_;
    iStack_ebc = auVar55._12_4_;
    auVar49._4_4_ = iStack_ec4 + iStack_e60;
    auVar49._0_4_ = local_ec8 + iStack_e64;
    auVar49._8_4_ = iStack_ec0 + iStack_e5c;
    auVar49._12_4_ = iStack_ebc + local_e48;
    auVar55 = sha256msg2_sha(auVar49,auVar58);
    auVar57 = sha256msg1_sha(auVar57,auVar58);
    local_e28 = auVar55._0_4_;
    iStack_e24 = auVar55._4_4_;
    iStack_e20 = auVar55._8_4_;
    iStack_e1c = auVar55._12_4_;
    iVar54 = local_e28 + -0x1b64963f;
    auVar15._4_4_ = iStack_e24 + -0x1041b87a;
    auVar15._0_4_ = iVar54;
    auVar15._12_4_ = iStack_e1c + 0x240ca1cc;
    auVar15._8_4_ = iStack_e20 + 0xfc19dc6;
    auVar59 = sha256rnds2_sha(auVar59,auVar60,auVar15);
    auVar14._4_4_ = iStack_e1c + 0x240ca1cc;
    auVar14._0_4_ = iStack_e20 + 0xfc19dc6;
    auVar14._8_4_ = iVar54;
    auVar14._12_4_ = iVar54;
    auVar60 = sha256rnds2_sha(auVar60,auVar59,auVar14);
    local_ee8 = auVar56._0_4_;
    iStack_ee4 = auVar56._4_4_;
    iStack_ee0 = auVar56._8_4_;
    iStack_edc = auVar56._12_4_;
    auVar48._4_4_ = iStack_ee4 + iStack_e40;
    auVar48._0_4_ = local_ee8 + iStack_e44;
    auVar48._8_4_ = iStack_ee0 + iStack_e3c;
    auVar48._12_4_ = iStack_edc + local_e28;
    auVar56 = sha256msg2_sha(auVar48,auVar55);
    auVar58 = sha256msg1_sha(auVar58,auVar55);
    local_e08 = auVar56._0_4_;
    iStack_e04 = auVar56._4_4_;
    iStack_e00 = auVar56._8_4_;
    iStack_dfc = auVar56._12_4_;
    iVar54 = local_e08 + 0x2de92c6f;
    auVar17._4_4_ = iStack_e04 + 0x4a7484aa;
    auVar17._0_4_ = iVar54;
    auVar17._12_4_ = iStack_dfc + 0x76f988da;
    auVar17._8_4_ = iStack_e00 + 0x5cb0a9dc;
    auVar59 = sha256rnds2_sha(auVar59,auVar60,auVar17);
    auVar16._4_4_ = iStack_dfc + 0x76f988da;
    auVar16._0_4_ = iStack_e00 + 0x5cb0a9dc;
    auVar16._8_4_ = iVar54;
    auVar16._12_4_ = iVar54;
    auVar60 = sha256rnds2_sha(auVar60,auVar59,auVar16);
    local_f08 = auVar57._0_4_;
    iStack_f04 = auVar57._4_4_;
    iStack_f00 = auVar57._8_4_;
    iStack_efc = auVar57._12_4_;
    auVar47._4_4_ = iStack_f04 + iStack_e20;
    auVar47._0_4_ = local_f08 + iStack_e24;
    auVar47._8_4_ = iStack_f00 + iStack_e1c;
    auVar47._12_4_ = iStack_efc + local_e08;
    auVar57 = sha256msg2_sha(auVar47,auVar56);
    auVar55 = sha256msg1_sha(auVar55,auVar56);
    local_de8 = auVar57._0_4_;
    iStack_de4 = auVar57._4_4_;
    iStack_de0 = auVar57._8_4_;
    iStack_ddc = auVar57._12_4_;
    iVar54 = local_de8 + -0x67c1aeae;
    auVar19._4_4_ = iStack_de4 + -0x57ce3993;
    auVar19._0_4_ = iVar54;
    auVar19._12_4_ = iStack_ddc + -0x40a68039;
    auVar19._8_4_ = iStack_de0 + -0x4ffcd838;
    auVar59 = sha256rnds2_sha(auVar59,auVar60,auVar19);
    auVar18._4_4_ = iStack_ddc + -0x40a68039;
    auVar18._0_4_ = iStack_de0 + -0x4ffcd838;
    auVar18._8_4_ = iVar54;
    auVar18._12_4_ = iVar54;
    auVar60 = sha256rnds2_sha(auVar60,auVar59,auVar18);
    local_f28 = auVar58._0_4_;
    iStack_f24 = auVar58._4_4_;
    iStack_f20 = auVar58._8_4_;
    iStack_f1c = auVar58._12_4_;
    auVar46._4_4_ = iStack_f24 + iStack_e00;
    auVar46._0_4_ = local_f28 + iStack_e04;
    auVar46._8_4_ = iStack_f20 + iStack_dfc;
    auVar46._12_4_ = iStack_f1c + local_de8;
    auVar58 = sha256msg2_sha(auVar46,auVar57);
    auVar56 = sha256msg1_sha(auVar56,auVar57);
    local_dc8 = auVar58._0_4_;
    iStack_dc4 = auVar58._4_4_;
    iStack_dc0 = auVar58._8_4_;
    iStack_dbc = auVar58._12_4_;
    iVar54 = local_dc8 + -0x391ff40d;
    auVar21._4_4_ = iStack_dc4 + -0x2a586eb9;
    auVar21._0_4_ = iVar54;
    auVar21._12_4_ = iStack_dbc + 0x14292967;
    auVar21._8_4_ = iStack_dc0 + 0x6ca6351;
    auVar59 = sha256rnds2_sha(auVar59,auVar60,auVar21);
    auVar20._4_4_ = iStack_dbc + 0x14292967;
    auVar20._0_4_ = iStack_dc0 + 0x6ca6351;
    auVar20._8_4_ = iVar54;
    auVar20._12_4_ = iVar54;
    auVar60 = sha256rnds2_sha(auVar60,auVar59,auVar20);
    local_f48 = auVar55._0_4_;
    iStack_f44 = auVar55._4_4_;
    iStack_f40 = auVar55._8_4_;
    iStack_f3c = auVar55._12_4_;
    auVar45._4_4_ = iStack_f44 + iStack_de0;
    auVar45._0_4_ = local_f48 + iStack_de4;
    auVar45._8_4_ = iStack_f40 + iStack_ddc;
    auVar45._12_4_ = iStack_f3c + local_dc8;
    auVar55 = sha256msg2_sha(auVar45,auVar58);
    auVar57 = sha256msg1_sha(auVar57,auVar58);
    local_da8 = auVar55._0_4_;
    iStack_da4 = auVar55._4_4_;
    iStack_da0 = auVar55._8_4_;
    iStack_d9c = auVar55._12_4_;
    iVar54 = local_da8 + 0x27b70a85;
    auVar23._4_4_ = iStack_da4 + 0x2e1b2138;
    auVar23._0_4_ = iVar54;
    auVar23._12_4_ = iStack_d9c + 0x53380d13;
    auVar23._8_4_ = iStack_da0 + 0x4d2c6dfc;
    auVar59 = sha256rnds2_sha(auVar59,auVar60,auVar23);
    auVar22._4_4_ = iStack_d9c + 0x53380d13;
    auVar22._0_4_ = iStack_da0 + 0x4d2c6dfc;
    auVar22._8_4_ = iVar54;
    auVar22._12_4_ = iVar54;
    auVar60 = sha256rnds2_sha(auVar60,auVar59,auVar22);
    local_f68 = auVar56._0_4_;
    iStack_f64 = auVar56._4_4_;
    iStack_f60 = auVar56._8_4_;
    iStack_f5c = auVar56._12_4_;
    auVar44._4_4_ = iStack_f64 + iStack_dc0;
    auVar44._0_4_ = local_f68 + iStack_dc4;
    auVar44._8_4_ = iStack_f60 + iStack_dbc;
    auVar44._12_4_ = iStack_f5c + local_da8;
    auVar56 = sha256msg2_sha(auVar44,auVar55);
    auVar58 = sha256msg1_sha(auVar58,auVar55);
    local_d88 = auVar56._0_4_;
    iStack_d84 = auVar56._4_4_;
    iStack_d80 = auVar56._8_4_;
    iStack_d7c = auVar56._12_4_;
    iVar54 = local_d88 + 0x650a7354;
    auVar25._4_4_ = iStack_d84 + 0x766a0abb;
    auVar25._0_4_ = iVar54;
    auVar25._12_4_ = iStack_d7c + -0x6d8dd37b;
    auVar25._8_4_ = iStack_d80 + -0x7e3d36d2;
    auVar59 = sha256rnds2_sha(auVar59,auVar60,auVar25);
    auVar24._4_4_ = iStack_d7c + -0x6d8dd37b;
    auVar24._0_4_ = iStack_d80 + -0x7e3d36d2;
    auVar24._8_4_ = iVar54;
    auVar24._12_4_ = iVar54;
    auVar60 = sha256rnds2_sha(auVar60,auVar59,auVar24);
    local_f88 = auVar57._0_4_;
    iStack_f84 = auVar57._4_4_;
    iStack_f80 = auVar57._8_4_;
    iStack_f7c = auVar57._12_4_;
    auVar43._4_4_ = iStack_f84 + iStack_da0;
    auVar43._0_4_ = local_f88 + iStack_da4;
    auVar43._8_4_ = iStack_f80 + iStack_d9c;
    auVar43._12_4_ = iStack_f7c + local_d88;
    auVar57 = sha256msg2_sha(auVar43,auVar56);
    auVar55 = sha256msg1_sha(auVar55,auVar56);
    local_d68 = auVar57._0_4_;
    iStack_d64 = auVar57._4_4_;
    iStack_d60 = auVar57._8_4_;
    iStack_d5c = auVar57._12_4_;
    iVar54 = local_d68 + -0x5d40175f;
    auVar27._4_4_ = iStack_d64 + -0x57e599b5;
    auVar27._0_4_ = iVar54;
    auVar27._12_4_ = iStack_d5c + -0x3893ae5d;
    auVar27._8_4_ = iStack_d60 + -0x3db47490;
    auVar59 = sha256rnds2_sha(auVar59,auVar60,auVar27);
    auVar26._4_4_ = iStack_d5c + -0x3893ae5d;
    auVar26._0_4_ = iStack_d60 + -0x3db47490;
    auVar26._8_4_ = iVar54;
    auVar26._12_4_ = iVar54;
    auVar60 = sha256rnds2_sha(auVar60,auVar59,auVar26);
    local_fa8 = auVar58._0_4_;
    iStack_fa4 = auVar58._4_4_;
    iStack_fa0 = auVar58._8_4_;
    iStack_f9c = auVar58._12_4_;
    auVar42._4_4_ = iStack_fa4 + iStack_d80;
    auVar42._0_4_ = local_fa8 + iStack_d84;
    auVar42._8_4_ = iStack_fa0 + iStack_d7c;
    auVar42._12_4_ = iStack_f9c + local_d68;
    auVar58 = sha256msg2_sha(auVar42,auVar57);
    auVar56 = sha256msg1_sha(auVar56,auVar57);
    local_d48 = auVar58._0_4_;
    iStack_d44 = auVar58._4_4_;
    iStack_d40 = auVar58._8_4_;
    iStack_d3c = auVar58._12_4_;
    iVar54 = local_d48 + -0x2e6d17e7;
    auVar29._4_4_ = iStack_d44 + -0x2966f9dc;
    auVar29._0_4_ = iVar54;
    auVar29._12_4_ = iStack_d3c + 0x106aa070;
    auVar29._8_4_ = iStack_d40 + -0xbf1ca7b;
    auVar59 = sha256rnds2_sha(auVar59,auVar60,auVar29);
    auVar28._4_4_ = iStack_d3c + 0x106aa070;
    auVar28._0_4_ = iStack_d40 + -0xbf1ca7b;
    auVar28._8_4_ = iVar54;
    auVar28._12_4_ = iVar54;
    auVar60 = sha256rnds2_sha(auVar60,auVar59,auVar28);
    local_fc8 = auVar55._0_4_;
    iStack_fc4 = auVar55._4_4_;
    iStack_fc0 = auVar55._8_4_;
    iStack_fbc = auVar55._12_4_;
    auVar41._4_4_ = iStack_fc4 + iStack_d60;
    auVar41._0_4_ = local_fc8 + iStack_d64;
    auVar41._8_4_ = iStack_fc0 + iStack_d5c;
    auVar41._12_4_ = iStack_fbc + local_d48;
    auVar55 = sha256msg2_sha(auVar41,auVar58);
    auVar57 = sha256msg1_sha(auVar57,auVar58);
    local_d28 = auVar55._0_4_;
    iStack_d24 = auVar55._4_4_;
    iStack_d20 = auVar55._8_4_;
    iStack_d1c = auVar55._12_4_;
    iVar54 = local_d28 + 0x19a4c116;
    auVar31._4_4_ = iStack_d24 + 0x1e376c08;
    auVar31._0_4_ = iVar54;
    auVar31._12_4_ = iStack_d1c + 0x34b0bcb5;
    auVar31._8_4_ = iStack_d20 + 0x2748774c;
    auVar59 = sha256rnds2_sha(auVar59,auVar60,auVar31);
    auVar30._4_4_ = iStack_d1c + 0x34b0bcb5;
    auVar30._0_4_ = iStack_d20 + 0x2748774c;
    auVar30._8_4_ = iVar54;
    auVar30._12_4_ = iVar54;
    auVar60 = sha256rnds2_sha(auVar60,auVar59,auVar30);
    local_fe8 = auVar56._0_4_;
    iStack_fe4 = auVar56._4_4_;
    iStack_fe0 = auVar56._8_4_;
    iStack_fdc = auVar56._12_4_;
    auVar40._4_4_ = iStack_fe4 + iStack_d40;
    auVar40._0_4_ = local_fe8 + iStack_d44;
    auVar40._8_4_ = iStack_fe0 + iStack_d3c;
    auVar40._12_4_ = iStack_fdc + local_d28;
    auVar56 = sha256msg2_sha(auVar40,auVar55);
    auVar55 = sha256msg1_sha(auVar58,auVar55);
    local_d08 = auVar56._0_4_;
    iStack_d04 = auVar56._4_4_;
    iStack_d00 = auVar56._8_4_;
    iStack_cfc = auVar56._12_4_;
    iVar54 = local_d08 + 0x391c0cb3;
    auVar33._4_4_ = iStack_d04 + 0x4ed8aa4a;
    auVar33._0_4_ = iVar54;
    auVar33._12_4_ = iStack_cfc + 0x682e6ff3;
    auVar33._8_4_ = iStack_d00 + 0x5b9cca4f;
    auVar58 = sha256rnds2_sha(auVar59,auVar60,auVar33);
    auVar32._4_4_ = iStack_cfc + 0x682e6ff3;
    auVar32._0_4_ = iStack_d00 + 0x5b9cca4f;
    auVar32._8_4_ = iVar54;
    auVar32._12_4_ = iVar54;
    auVar59 = sha256rnds2_sha(auVar60,auVar58,auVar32);
    local_1028 = auVar57._0_4_;
    iStack_1024 = auVar57._4_4_;
    iStack_1020 = auVar57._8_4_;
    iStack_101c = auVar57._12_4_;
    auVar38._4_4_ = iStack_1024 + iStack_d20;
    auVar38._0_4_ = local_1028 + iStack_d24;
    auVar38._8_4_ = iStack_1020 + iStack_d1c;
    auVar38._12_4_ = iStack_101c + local_d08;
    auVar56 = sha256msg2_sha(auVar38,auVar56);
    local_ce8 = auVar56._0_4_;
    iStack_ce4 = auVar56._4_4_;
    iStack_ce0 = auVar56._8_4_;
    iStack_cdc = auVar56._12_4_;
    iVar54 = local_ce8 + 0x748f82ee;
    auVar35._4_4_ = iStack_ce4 + 0x78a5636f;
    auVar35._0_4_ = iVar54;
    auVar35._12_4_ = iStack_cdc + -0x7338fdf8;
    auVar35._8_4_ = iStack_ce0 + -0x7b3787ec;
    auVar57 = sha256rnds2_sha(auVar58,auVar59,auVar35);
    auVar34._4_4_ = iStack_cdc + -0x7338fdf8;
    auVar34._0_4_ = iStack_ce0 + -0x7b3787ec;
    auVar34._8_4_ = iVar54;
    auVar34._12_4_ = iVar54;
    auVar58 = sha256rnds2_sha(auVar59,auVar57,auVar34);
    local_1008 = auVar55._0_4_;
    iStack_1004 = auVar55._4_4_;
    iStack_1000 = auVar55._8_4_;
    iStack_ffc = auVar55._12_4_;
    auVar39._4_4_ = iStack_1004 + iStack_d00;
    auVar39._0_4_ = local_1008 + iStack_d04;
    auVar39._8_4_ = iStack_1000 + iStack_cfc;
    auVar39._12_4_ = iStack_ffc + local_ce8;
    auVar55 = sha256msg2_sha(auVar39,auVar56);
    local_cc8 = auVar55._0_4_;
    iStack_cc4 = auVar55._4_4_;
    iStack_cc0 = auVar55._8_4_;
    iStack_cbc = auVar55._12_4_;
    local_cc8 = local_cc8 + -0x6f410006;
    auVar37._4_4_ = iStack_cc4 + -0x5baf9315;
    auVar37._0_4_ = local_cc8;
    auVar37._12_4_ = iStack_cbc + -0x398e870e;
    auVar37._8_4_ = iStack_cc0 + -0x41065c09;
    auVar55 = sha256rnds2_sha(auVar57,auVar58,auVar37);
    auVar36._4_4_ = iStack_cbc + -0x398e870e;
    auVar36._0_4_ = iStack_cc0 + -0x41065c09;
    auVar36._8_4_ = local_cc8;
    auVar36._12_4_ = local_cc8;
    auVar56 = sha256rnds2_sha(auVar58,auVar55,auVar36);
    local_c88 = auVar56._0_4_;
    iStack_c84 = auVar56._4_4_;
    iStack_c80 = auVar56._8_4_;
    iStack_c7c = auVar56._12_4_;
    s0[0]._4_4_ = iStack_c84 + s0[0]._4_4_;
    s0[0]._0_4_ = local_c88 + (int)s0[0];
    s0[1]._4_4_ = iStack_c7c + s0[1]._4_4_;
    s0[1]._0_4_ = iStack_c80 + (int)s0[1];
    local_ca8 = auVar55._0_4_;
    iStack_ca4 = auVar55._4_4_;
    iStack_ca0 = auVar55._8_4_;
    iStack_c9c = auVar55._12_4_;
    s1[0]._4_4_ = iStack_ca4 + s1[0]._4_4_;
    s1[0]._0_4_ = local_ca8 + (int)s1[0];
    s1[1]._4_4_ = iStack_c9c + s1[1]._4_4_;
    s1[1]._0_4_ = iStack_ca0 + (int)s1[1];
    chunk_local = chunk_local + 0x40;
    blocks_local = blocks_local - 1;
  }
  auVar58._4_4_ = (int)s0[1];
  auVar58._0_4_ = s0[1]._4_4_;
  auVar58._8_4_ = s0[0]._4_4_;
  auVar58._12_4_ = (int)s0[0];
  auVar57._4_4_ = (int)s1[0];
  auVar57._0_4_ = s1[0]._4_4_;
  auVar57._8_4_ = s1[1]._4_4_;
  auVar57._12_4_ = (int)s1[1];
  auVar55 = pblendw(auVar58,auVar57,0xf0);
  uVar3 = CONCAT44((int)s0[1],s0[1]._4_4_);
  s0[1] = auVar55._8_8_;
  *(undefined8 *)s = uVar3;
  *(longlong *)(s + 2) = s0[1];
  *(longlong *)(s + 4) = lVar2;
  *(ulong *)(s + 6) = CONCAT44((int)s0[0],s0[0]._4_4_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Transform(uint32_t* s, const unsigned char* chunk, size_t blocks)
{
    __m128i m0, m1, m2, m3, s0, s1, so0, so1;

    /* Load state */
    s0 = _mm_loadu_si128((const __m128i*)s);
    s1 = _mm_loadu_si128((const __m128i*)(s + 4));
    Shuffle(s0, s1);

    while (blocks--) {
        /* Remember old state */
        so0 = s0;
        so1 = s1;

        /* Load data and transform */
        m0 = Load(chunk);
        QuadRound(s0, s1, m0, 0xe9b5dba5b5c0fbcfull, 0x71374491428a2f98ull);
        m1 = Load(chunk + 16);
        QuadRound(s0, s1, m1, 0xab1c5ed5923f82a4ull, 0x59f111f13956c25bull);
        ShiftMessageA(m0, m1);
        m2 = Load(chunk + 32);
        QuadRound(s0, s1, m2, 0x550c7dc3243185beull, 0x12835b01d807aa98ull);
        ShiftMessageA(m1, m2);
        m3 = Load(chunk + 48);
        QuadRound(s0, s1, m3, 0xc19bf1749bdc06a7ull, 0x80deb1fe72be5d74ull);
        ShiftMessageB(m2, m3, m0);
        QuadRound(s0, s1, m0, 0x240ca1cc0fc19dc6ull, 0xefbe4786E49b69c1ull);
        ShiftMessageB(m3, m0, m1);
        QuadRound(s0, s1, m1, 0x76f988da5cb0a9dcull, 0x4a7484aa2de92c6full);
        ShiftMessageB(m0, m1, m2);
        QuadRound(s0, s1, m2, 0xbf597fc7b00327c8ull, 0xa831c66d983e5152ull);
        ShiftMessageB(m1, m2, m3);
        QuadRound(s0, s1, m3, 0x1429296706ca6351ull, 0xd5a79147c6e00bf3ull);
        ShiftMessageB(m2, m3, m0);
        QuadRound(s0, s1, m0, 0x53380d134d2c6dfcull, 0x2e1b213827b70a85ull);
        ShiftMessageB(m3, m0, m1);
        QuadRound(s0, s1, m1, 0x92722c8581c2c92eull, 0x766a0abb650a7354ull);
        ShiftMessageB(m0, m1, m2);
        QuadRound(s0, s1, m2, 0xc76c51A3c24b8b70ull, 0xa81a664ba2bfe8a1ull);
        ShiftMessageB(m1, m2, m3);
        QuadRound(s0, s1, m3, 0x106aa070f40e3585ull, 0xd6990624d192e819ull);
        ShiftMessageB(m2, m3, m0);
        QuadRound(s0, s1, m0, 0x34b0bcb52748774cull, 0x1e376c0819a4c116ull);
        ShiftMessageB(m3, m0, m1);
        QuadRound(s0, s1, m1, 0x682e6ff35b9cca4full, 0x4ed8aa4a391c0cb3ull);
        ShiftMessageC(m0, m1, m2);
        QuadRound(s0, s1, m2, 0x8cc7020884c87814ull, 0x78a5636f748f82eeull);
        ShiftMessageC(m1, m2, m3);
        QuadRound(s0, s1, m3, 0xc67178f2bef9A3f7ull, 0xa4506ceb90befffaull);

        /* Combine with old state */
        s0 = _mm_add_epi32(s0, so0);
        s1 = _mm_add_epi32(s1, so1);

        /* Advance */
        chunk += 64;
    }

    Unshuffle(s0, s1);
    _mm_storeu_si128((__m128i*)s, s0);
    _mm_storeu_si128((__m128i*)(s + 4), s1);
}